

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

void __thiscall IDisk::IDisk(IDisk *this)

{
  long lVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  this->_vptr_IDisk = (_func_int **)&PTR__IDisk_001828c8;
  this->nb_sides_ = '\x01';
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&this->side_[0].tracks + lVar1) = 0;
    *(undefined4 *)((long)&this->side_[0].nb_tracks + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x20);
  (this->current_disk_path_)._M_dataplus._M_p = (pointer)&(this->current_disk_path_).field_2;
  lVar1 = 0;
  (this->current_disk_path_)._M_string_length = 0;
  (this->current_disk_path_).field_2._M_local_buf[0] = '\0';
  this->load_progress_ = 0xffffffff;
  this->log_ = (ILog *)0x0;
  this->head_position_ = 0;
  this->disk_modified_ = false;
  this->fixed_speed_ = false;
  std::__cxx11::string::_M_replace((ulong)&this->current_disk_path_,0,(char *)0x0,0x16b9cb);
  this->side_[0].nb_tracks = 0;
  this->side_[0].tracks = (MFMTrack *)0x0;
  this->side_[1].nb_tracks = 0;
  this->side_[1].tracks = (MFMTrack *)0x0;
  do {
    (mfm_start_of_track_pattern + lVar1 * 2)[0] = '\x01';
    (mfm_start_of_track_pattern + lVar1 * 2)[1] = '\0';
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  lVar1 = 0;
  do {
    (mfm_start_of_track_pattern + lVar1 * 2 + 0x10)[0] = '\x01';
    (mfm_start_of_track_pattern + lVar1 * 2 + 0x10)[1] = '\0';
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  puVar2 = mfm_start_of_track_pattern + 0x20;
  uVar3 = 0xf;
  do {
    *puVar2 = (0x5224U >> (uVar3 & 0x1f) & 1) != 0;
    puVar2 = puVar2 + 1;
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  puVar2 = mfm_start_of_track_pattern + 0x30;
  uVar3 = 0xf;
  do {
    *puVar2 = (0x5224U >> (uVar3 & 0x1f) & 1) != 0;
    puVar2 = puVar2 + 1;
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  puVar2 = mfm_start_of_track_pattern + 0x40;
  uVar3 = 0xf;
  do {
    *puVar2 = (0x5224U >> (uVar3 & 0x1f) & 1) != 0;
    puVar2 = puVar2 + 1;
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  lVar1 = 0;
  AddByteToTrack(mfm_start_of_track_pattern,0x50,0xfc,8,'\0');
  do {
    (mfm_start_of_track_pattern2 + lVar1 * 2)[0] = '\x01';
    (mfm_start_of_track_pattern2 + lVar1 * 2)[1] = '\0';
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  lVar1 = 0;
  do {
    (mfm_start_of_track_pattern2 + lVar1 * 2 + 0x10)[0] = '\x01';
    (mfm_start_of_track_pattern2 + lVar1 * 2 + 0x10)[1] = '\0';
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  puVar2 = mfm_start_of_track_pattern2 + 0x20;
  uVar3 = 0xf;
  do {
    *puVar2 = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
    puVar2 = puVar2 + 1;
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  puVar2 = mfm_start_of_track_pattern2 + 0x30;
  uVar3 = 0xf;
  do {
    *puVar2 = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
    puVar2 = puVar2 + 1;
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  puVar2 = mfm_start_of_track_pattern2 + 0x40;
  uVar3 = 0xf;
  do {
    *puVar2 = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
    puVar2 = puVar2 + 1;
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  bVar5 = false;
  AddByteToTrack(mfm_start_of_track_pattern2,0x50,0xfe,8,'\0');
  iVar4 = 7;
  puVar2 = mfm_gap_4_e + 1;
  do {
    bVar6 = !bVar5;
    bVar7 = (1 << ((byte)iVar4 & 0x1f) & 0x4eU) == 0;
    bVar5 = !bVar7;
    *puVar2 = !bVar7;
    puVar2[-1] = bVar7 && bVar6;
    puVar2 = puVar2 + 2;
    bVar6 = iVar4 != 0;
    iVar4 = iVar4 + -1;
  } while (bVar6);
  return;
}

Assistant:

IDisk::IDisk(): nb_sides_(1)
{
   load_progress_ = -1; // No progress by default
   log_ = nullptr;
   fixed_speed_ = false;

   head_position_ = 0;
   disk_modified_ = false;

   current_disk_path_ = "";

   side_[0].nb_tracks = 0;
   side_[0].tracks = nullptr;
   side_[1].nb_tracks = 0;
   side_[1].tracks = nullptr;

   int index_bit = 0;
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0x00);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0x00);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0xFC);

   index_bit = 0;
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0x00);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0x00);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xFE);

   AddByteToTrack(mfm_gap_4_e, 0, 0x4E);
}